

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_scandir_empty_dir(void)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  uint uVar3;
  int iVar4;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar5;
  uv_loop_t *extraout_RAX;
  uv_loop_t *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 *__s1;
  __off64_t _Var9;
  void *pvVar10;
  void *pvVar11;
  undefined8 extraout_RAX_00;
  char *pcVar12;
  uv_fs_t *puVar13;
  char *pcVar14;
  undefined1 *puVar15;
  long unaff_R12;
  ulong uVar16;
  uv_fs_t *__s;
  long lVar17;
  void *pvVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uv_buf_t uVar21;
  uv_dirent_t dent;
  uv_fs_t req;
  undefined1 auStack_a52 [2];
  code *pcStack_a50;
  undefined8 uStack_a48;
  void *pvStack_a40;
  long lStack_a38;
  undefined1 auStack_9c8 [16];
  undefined1 auStack_9b8 [16];
  undefined8 uStack_9a0;
  uv_fs_t *puStack_998;
  uv_fs_t *puStack_990;
  undefined8 uStack_988;
  code *pcStack_978;
  code *pcStack_970;
  undefined8 uStack_968;
  undefined1 auStack_958 [16];
  undefined1 auStack_948 [16];
  undefined1 auStack_938 [16];
  undefined1 auStack_928 [16];
  undefined1 auStack_918 [256];
  undefined1 auStack_818 [256];
  undefined1 auStack_718 [128];
  undefined1 auStack_698 [136];
  undefined1 *puStack_610;
  uv_fs_t *puStack_608;
  code *pcStack_600;
  undefined8 uStack_5f8;
  code *pcStack_5e8;
  undefined8 uStack_5e0;
  code *pcStack_5d0;
  uv_fs_t *puStack_5c8;
  code *pcStack_5c0;
  uv_fs_t uStack_5b8;
  uv_fs_t *puStack_400;
  uv_fs_t *puStack_3f8;
  code *pcStack_3f0;
  uv_fs_t *puStack_3e8;
  undefined1 auStack_3d8 [8];
  code *pcStack_3d0;
  undefined1 auStack_3c8 [16];
  undefined1 auStack_3b8 [496];
  void *local_170;
  void *local_168;
  
  auStack_3b8._472_8_ = (void *)0x156dcf;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar12 = "./empty_dir/";
  auStack_3b8._472_8_ = (void *)0x156df7;
  uv_fs_mkdir(0,&stack0xfffffffffffffe38,"./empty_dir/",0x1ff,0);
  auStack_3b8._472_8_ = (void *)0x156dff;
  uv_fs_req_cleanup(&stack0xfffffffffffffe38);
  auStack_3b8._472_8_ = (void *)0x156e11;
  memset(&stack0xfffffffffffffe38,0xdb,0x1b8);
  puVar5 = (uv_loop_t *)0x0;
  auStack_3b8._472_8_ = (void *)0x156e23;
  iVar2 = uv_fs_scandir(0,&stack0xfffffffffffffe38,"./empty_dir/",0,0);
  if (iVar2 == 0) {
    if (local_170 != (void *)0x0) goto LAB_00156f1a;
    if (local_168 != (void *)0x0) goto LAB_00156f1f;
    puVar5 = (uv_loop_t *)&stack0xfffffffffffffe38;
    auStack_3b8._472_8_ = (void *)0x156e50;
    iVar2 = uv_fs_scandir_next(puVar5,auStack_3b8 + 0x1e0);
    if (iVar2 != -0xfff) goto LAB_00156f24;
    auStack_3b8._472_8_ = (void *)0x156e65;
    uv_fs_req_cleanup(&stack0xfffffffffffffe38);
    auStack_3b8._472_8_ = (void *)0x156e88;
    puVar5 = loop;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"./empty_dir/",0,empty_scandir_cb);
    if (iVar2 != 0) goto LAB_00156f29;
    if (scandir_cb_count != 0) goto LAB_00156f2e;
    auStack_3b8._472_8_ = (void *)0x156eab;
    puVar5 = loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_00156f33;
    auStack_3b8._472_8_ = (void *)0x156ecc;
    uv_fs_rmdir(0,&stack0xfffffffffffffe38,"./empty_dir/",0);
    auStack_3b8._472_8_ = (void *)0x156ed4;
    uv_fs_req_cleanup(&stack0xfffffffffffffe38);
    auStack_3b8._472_8_ = (void *)0x156ed9;
    pcVar12 = (char *)uv_default_loop();
    auStack_3b8._472_8_ = (void *)0x156eed;
    uv_walk(pcVar12,close_walk_cb,0);
    auStack_3b8._472_8_ = (void *)0x156ef7;
    uv_run(pcVar12,0);
    auStack_3b8._472_8_ = (void *)0x156efc;
    puVar5 = (uv_loop_t *)uv_default_loop();
    auStack_3b8._472_8_ = (void *)0x156f04;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    auStack_3b8._472_8_ = (void *)0x156f1a;
    run_test_fs_scandir_empty_dir_cold_1();
LAB_00156f1a:
    auStack_3b8._472_8_ = (void *)0x156f1f;
    run_test_fs_scandir_empty_dir_cold_2();
LAB_00156f1f:
    auStack_3b8._472_8_ = (void *)0x156f24;
    run_test_fs_scandir_empty_dir_cold_3();
LAB_00156f24:
    auStack_3b8._472_8_ = (void *)0x156f29;
    run_test_fs_scandir_empty_dir_cold_4();
LAB_00156f29:
    auStack_3b8._472_8_ = (void *)0x156f2e;
    run_test_fs_scandir_empty_dir_cold_5();
LAB_00156f2e:
    auStack_3b8._472_8_ = (void *)0x156f33;
    run_test_fs_scandir_empty_dir_cold_6();
LAB_00156f33:
    auStack_3b8._472_8_ = (void *)0x156f38;
    run_test_fs_scandir_empty_dir_cold_7();
  }
  auStack_3b8._472_8_ = empty_scandir_cb;
  run_test_fs_scandir_empty_dir_cold_8();
  if (puVar5 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00156f9e;
    if (scandir_req.result != 0) goto LAB_00156fa3;
    if (scandir_req.ptr != (void *)0x0) goto LAB_00156fa8;
    auStack_3b8._448_8_ = (_func_void *)0x156f7b;
    iVar2 = uv_fs_scandir_next(&scandir_req,auStack_3b8 + 0x1d0);
    if (iVar2 == -0xfff) {
      auStack_3b8._448_8_ = (_func_void *)0x156f8e;
      iVar2 = uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return iVar2;
    }
  }
  else {
    auStack_3b8._448_8_ = (_func_void *)0x156f9e;
    empty_scandir_cb_cold_1();
LAB_00156f9e:
    auStack_3b8._448_8_ = (_func_void *)0x156fa3;
    empty_scandir_cb_cold_2();
LAB_00156fa3:
    auStack_3b8._448_8_ = (_func_void *)0x156fa8;
    empty_scandir_cb_cold_3();
LAB_00156fa8:
    auStack_3b8._448_8_ = (_func_void *)0x156fad;
    empty_scandir_cb_cold_4();
  }
  auStack_3b8._448_8_ = run_test_fs_scandir_non_existent_dir;
  empty_scandir_cb_cold_5();
  pcStack_3d0 = (code *)0x156fc1;
  auStack_3b8._440_8_ = pcVar12;
  auStack_3b8._448_8_ = &stack0xfffffffffffffe38;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar12 = "./non_existent_dir/";
  __s = (uv_fs_t *)auStack_3b8;
  pcStack_3d0 = (code *)0x156fe3;
  uv_fs_rmdir(0,__s,"./non_existent_dir/",0);
  pcStack_3d0 = (code *)0x156feb;
  uv_fs_req_cleanup(__s);
  pcStack_3d0 = (code *)0x156ffd;
  memset(__s,0xdb,0x1b8);
  puVar5 = (uv_loop_t *)0x0;
  pcStack_3d0 = (code *)0x15700f;
  iVar2 = uv_fs_scandir(0,__s,"./non_existent_dir/",0,0);
  if (iVar2 == -2) {
    if ((void *)auStack_3b8._88_8_ != (void *)0xfffffffffffffffe) goto LAB_001570dd;
    if ((void *)auStack_3b8._96_8_ != (void *)0x0) goto LAB_001570e2;
    puVar5 = (uv_loop_t *)auStack_3b8;
    pcStack_3d0 = (code *)0x15703d;
    iVar2 = uv_fs_scandir_next(puVar5,auStack_3c8);
    if (iVar2 != -2) goto LAB_001570e7;
    pcStack_3d0 = (code *)0x157050;
    uv_fs_req_cleanup(auStack_3b8);
    pcStack_3d0 = (code *)0x157073;
    puVar5 = loop;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"./non_existent_dir/",0,non_existent_scandir_cb);
    if (iVar2 != 0) goto LAB_001570ec;
    if (scandir_cb_count != 0) goto LAB_001570f1;
    pcStack_3d0 = (code *)0x15708e;
    puVar5 = loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_001570f6;
    pcStack_3d0 = (code *)0x15709c;
    pcVar12 = (char *)uv_default_loop();
    pcStack_3d0 = (code *)0x1570b0;
    uv_walk(pcVar12,close_walk_cb,0);
    pcStack_3d0 = (code *)0x1570ba;
    uv_run(pcVar12,0);
    pcStack_3d0 = (code *)0x1570bf;
    puVar5 = (uv_loop_t *)uv_default_loop();
    pcStack_3d0 = (code *)0x1570c7;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_3d0 = (code *)0x1570dd;
    run_test_fs_scandir_non_existent_dir_cold_1();
LAB_001570dd:
    pcStack_3d0 = (code *)0x1570e2;
    run_test_fs_scandir_non_existent_dir_cold_2();
LAB_001570e2:
    pcStack_3d0 = (code *)0x1570e7;
    run_test_fs_scandir_non_existent_dir_cold_3();
LAB_001570e7:
    pcStack_3d0 = (code *)0x1570ec;
    run_test_fs_scandir_non_existent_dir_cold_4();
LAB_001570ec:
    pcStack_3d0 = (code *)0x1570f1;
    run_test_fs_scandir_non_existent_dir_cold_5();
LAB_001570f1:
    pcStack_3d0 = (code *)0x1570f6;
    run_test_fs_scandir_non_existent_dir_cold_6();
LAB_001570f6:
    pcStack_3d0 = (code *)0x1570fb;
    run_test_fs_scandir_non_existent_dir_cold_7();
  }
  pcStack_3d0 = non_existent_scandir_cb;
  run_test_fs_scandir_non_existent_dir_cold_8();
  if (puVar5 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_0015715f;
    if (scandir_req.result != -2) goto LAB_00157164;
    if (scandir_req.ptr != (void *)0x0) goto LAB_00157169;
    puStack_3e8 = (uv_fs_t *)0x15713e;
    iVar2 = uv_fs_scandir_next(&scandir_req,auStack_3d8);
    if (iVar2 == -2) {
      puStack_3e8 = (uv_fs_t *)0x15714f;
      iVar2 = uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return iVar2;
    }
  }
  else {
    puStack_3e8 = (uv_fs_t *)0x15715f;
    non_existent_scandir_cb_cold_1();
LAB_0015715f:
    puStack_3e8 = (uv_fs_t *)0x157164;
    non_existent_scandir_cb_cold_2();
LAB_00157164:
    puStack_3e8 = (uv_fs_t *)0x157169;
    non_existent_scandir_cb_cold_3();
LAB_00157169:
    puStack_3e8 = (uv_fs_t *)0x15716e;
    non_existent_scandir_cb_cold_4();
  }
  puStack_3e8 = (uv_fs_t *)run_test_fs_scandir_file;
  non_existent_scandir_cb_cold_5();
  pcStack_3f0 = (code *)0x157179;
  puStack_3e8 = (uv_fs_t *)pcVar12;
  loop = (uv_loop_t *)uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  pcStack_3f0 = (code *)0x15719a;
  iVar2 = uv_fs_scandir(0,&scandir_req,"test/fixtures/empty_file",0,0);
  if (iVar2 == -0x14) {
    puVar13 = &scandir_req;
    pcStack_3f0 = (code *)0x1571b2;
    uv_fs_req_cleanup(&scandir_req);
    pcStack_3f0 = (code *)0x1571d1;
    puVar5 = loop;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"test/fixtures/empty_file",0,file_scandir_cb);
    if (iVar2 != 0) goto LAB_00157232;
    if (scandir_cb_count != 0) goto LAB_00157237;
    pcStack_3f0 = (code *)0x1571ec;
    puVar5 = loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_0015723c;
    pcStack_3f0 = (code *)0x1571fa;
    puVar13 = (uv_fs_t *)uv_default_loop();
    pcStack_3f0 = (code *)0x15720e;
    uv_walk(puVar13,close_walk_cb,0);
    pcStack_3f0 = (code *)0x157218;
    uv_run(puVar13,0);
    pcStack_3f0 = (code *)0x15721d;
    puVar5 = (uv_loop_t *)uv_default_loop();
    pcStack_3f0 = (code *)0x157225;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_3f0 = (code *)0x157232;
    run_test_fs_scandir_file_cold_1();
    puVar13 = (uv_fs_t *)pcVar12;
LAB_00157232:
    pcStack_3f0 = (code *)0x157237;
    run_test_fs_scandir_file_cold_2();
LAB_00157237:
    pcStack_3f0 = (code *)0x15723c;
    run_test_fs_scandir_file_cold_3();
LAB_0015723c:
    pcStack_3f0 = (code *)0x157241;
    run_test_fs_scandir_file_cold_4();
  }
  pcStack_3f0 = file_scandir_cb;
  run_test_fs_scandir_file_cold_5();
  if (puVar5 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00157289;
    if (scandir_req.result != -0x14) goto LAB_0015728e;
    if (scandir_req.ptr == (void *)0x0) {
      puStack_3f8 = (uv_fs_t *)0x15727c;
      pcStack_3f0._0_4_ = extraout_EAX;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return (int)pcStack_3f0;
    }
  }
  else {
    puStack_3f8 = (uv_fs_t *)0x157289;
    file_scandir_cb_cold_1();
LAB_00157289:
    puStack_3f8 = (uv_fs_t *)0x15728e;
    file_scandir_cb_cold_2();
LAB_0015728e:
    puStack_3f8 = (uv_fs_t *)0x157293;
    file_scandir_cb_cold_3();
  }
  puStack_3f8 = (uv_fs_t *)run_test_fs_open_dir;
  file_scandir_cb_cold_4();
  pcStack_5c0 = (code *)0x1572a7;
  puStack_400 = puVar13;
  puStack_3f8 = __s;
  loop = (uv_loop_t *)uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  pcStack_5c0 = (code *)0x1572c7;
  uVar3 = uv_fs_open(0,&uStack_5b8,".",0,0,0);
  if ((int)uVar3 < 0) {
    pcStack_5c0 = (code *)0x157396;
    run_test_fs_open_dir_cold_1();
LAB_00157396:
    pcStack_5c0 = (code *)0x15739b;
    run_test_fs_open_dir_cold_2();
LAB_0015739b:
    pcStack_5c0 = (code *)0x1573a0;
    run_test_fs_open_dir_cold_3();
LAB_001573a0:
    pcStack_5c0 = (code *)0x1573a5;
    run_test_fs_open_dir_cold_4();
LAB_001573a5:
    pcStack_5c0 = (code *)0x1573aa;
    run_test_fs_open_dir_cold_5();
LAB_001573aa:
    pcStack_5c0 = (code *)0x1573af;
    run_test_fs_open_dir_cold_6();
LAB_001573af:
    pcStack_5c0 = (code *)0x1573b4;
    run_test_fs_open_dir_cold_7();
  }
  else {
    if (uStack_5b8.result < 0) goto LAB_00157396;
    if (uStack_5b8.ptr != (void *)0x0) goto LAB_0015739b;
    puVar13 = (uv_fs_t *)(ulong)uVar3;
    pcStack_5c0 = (code *)0x1572f4;
    uv_fs_req_cleanup();
    puVar5 = (uv_loop_t *)0x0;
    pcStack_5c0 = (code *)0x157302;
    iVar2 = uv_fs_close(0,&uStack_5b8,puVar13,0);
    __s = &uStack_5b8;
    if (iVar2 != 0) goto LAB_001573a0;
    pcStack_5c0 = (code *)0x15732c;
    puVar5 = loop;
    iVar2 = uv_fs_open(loop,&uStack_5b8,".",0,0,open_cb_simple);
    __s = &uStack_5b8;
    if (iVar2 != 0) goto LAB_001573a5;
    __s = &uStack_5b8;
    if (open_cb_count != 0) goto LAB_001573aa;
    pcStack_5c0 = (code *)0x157347;
    puVar5 = loop;
    uv_run(loop,0);
    __s = &uStack_5b8;
    if (open_cb_count != 1) goto LAB_001573af;
    pcStack_5c0 = (code *)0x157355;
    puVar13 = (uv_fs_t *)uv_default_loop();
    pcStack_5c0 = (code *)0x157369;
    uv_walk(puVar13,close_walk_cb,0);
    pcStack_5c0 = (code *)0x157373;
    uv_run(puVar13,0);
    pcStack_5c0 = (code *)0x157378;
    puVar5 = (uv_loop_t *)uv_default_loop();
    pcStack_5c0 = (code *)0x157380;
    iVar2 = uv_loop_close();
    __s = &uStack_5b8;
    if (iVar2 == 0) {
      return 0;
    }
  }
  pcStack_5c0 = open_cb_simple;
  run_test_fs_open_dir_cold_8();
  if (puVar5->backend_fd == 1) {
    puVar6 = (uv_loop_t *)puVar5->watcher_queue[0];
    if ((long)puVar6 < 0) goto LAB_001573e1;
    open_cb_count = open_cb_count + 1;
    puVar6 = puVar5;
    if (puVar5->watchers != (uv__io_t **)0x0) {
      iVar2 = uv_fs_req_cleanup();
      return iVar2;
    }
  }
  else {
    puStack_5c8 = (uv_fs_t *)0x1573e1;
    open_cb_simple_cold_1();
    puVar6 = extraout_RAX;
LAB_001573e1:
    puStack_5c8 = (uv_fs_t *)0x1573e9;
    open_cb_simple_cold_3();
  }
  iVar2 = (int)puVar6;
  puStack_5c8 = (uv_fs_t *)run_test_fs_file_open_append;
  open_cb_simple_cold_2();
  pcStack_5d0 = (code *)0x1573f4;
  puStack_5c8 = puVar13;
  fs_file_open_append(iVar2);
  pcStack_5d0 = (code *)0x1573f9;
  fs_file_open_append(iVar2);
  pcStack_5d0 = (code *)0x1573fe;
  uVar7 = uv_default_loop();
  pcStack_5d0 = (code *)0x157412;
  uv_walk(uVar7,close_walk_cb,0);
  pcStack_5d0 = (code *)0x15741c;
  uv_run(uVar7,0);
  pcStack_5d0 = (code *)0x157421;
  uVar8 = uv_default_loop();
  pcStack_5d0 = (code *)0x157429;
  iVar2 = uv_loop_close(uVar8);
  if (iVar2 == 0) {
    return 0;
  }
  pcStack_5d0 = fs_file_open_append;
  run_test_fs_file_open_append_cold_1();
  pcVar12 = "test_file";
  pcStack_5e8 = (code *)0x15744a;
  pcStack_5d0 = (code *)uVar7;
  unlink("test_file");
  pcStack_5e8 = (code *)0x15744f;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_5e8 = (code *)0x157475;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    pcStack_5e8 = (code *)0x15776a;
    fs_file_open_append_cold_1();
LAB_0015776a:
    pcStack_5e8 = (code *)0x15776f;
    fs_file_open_append_cold_2();
LAB_0015776f:
    pcStack_5e8 = (code *)0x157774;
    fs_file_open_append_cold_3();
LAB_00157774:
    pcStack_5e8 = (code *)0x157779;
    fs_file_open_append_cold_4();
LAB_00157779:
    pcStack_5e8 = (code *)0x15777e;
    fs_file_open_append_cold_5();
LAB_0015777e:
    pcStack_5e8 = (code *)0x157783;
    fs_file_open_append_cold_6();
LAB_00157783:
    pcStack_5e8 = (code *)0x157788;
    fs_file_open_append_cold_7();
LAB_00157788:
    pcStack_5e8 = (code *)0x15778d;
    fs_file_open_append_cold_8();
LAB_0015778d:
    pcStack_5e8 = (code *)0x157792;
    fs_file_open_append_cold_9();
LAB_00157792:
    pcStack_5e8 = (code *)0x157797;
    fs_file_open_append_cold_10();
LAB_00157797:
    pcStack_5e8 = (code *)0x15779c;
    fs_file_open_append_cold_11();
LAB_0015779c:
    pcStack_5e8 = (code *)0x1577a1;
    fs_file_open_append_cold_12();
LAB_001577a1:
    pcStack_5e8 = (code *)0x1577a6;
    fs_file_open_append_cold_13();
LAB_001577a6:
    pcStack_5e8 = (code *)0x1577ab;
    fs_file_open_append_cold_14();
LAB_001577ab:
    pcStack_5e8 = (code *)0x1577b0;
    fs_file_open_append_cold_15();
LAB_001577b0:
    pcStack_5e8 = (code *)0x1577b5;
    fs_file_open_append_cold_16();
LAB_001577b5:
    pcStack_5e8 = (code *)0x1577ba;
    fs_file_open_append_cold_17();
LAB_001577ba:
    pcStack_5e8 = (code *)0x1577bf;
    fs_file_open_append_cold_18();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015776a;
    pcStack_5e8 = (code *)0x157497;
    uv_fs_req_cleanup(&open_req1);
    pcStack_5e8 = (code *)0x1574a8;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_5e0 = 0;
    pcStack_5e8 = (code *)0x1574e6;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015776f;
    if (write_req.result < 0) goto LAB_00157774;
    pcStack_5e8 = (code *)0x157508;
    uv_fs_req_cleanup(&write_req);
    pcStack_5e8 = (code *)0x15751e;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157779;
    if (close_req.result != 0) goto LAB_0015777e;
    pcStack_5e8 = (code *)0x157540;
    uv_fs_req_cleanup(&close_req);
    pcStack_5e8 = (code *)0x157560;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x402,0,0);
    if (iVar2 < 0) goto LAB_00157783;
    if (open_req1.result._4_4_ < 0) goto LAB_00157788;
    pcStack_5e8 = (code *)0x157582;
    uv_fs_req_cleanup(&open_req1);
    pcStack_5e8 = (code *)0x157593;
    uVar21 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_5e0 = 0;
    pcStack_5e8 = (code *)0x1575d1;
    iov = uVar21;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015778d;
    if (write_req.result < 0) goto LAB_00157792;
    pcStack_5e8 = (code *)0x1575f3;
    uv_fs_req_cleanup(&write_req);
    pcStack_5e8 = (code *)0x157609;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157797;
    if (close_req.result != 0) goto LAB_0015779c;
    pcStack_5e8 = (code *)0x15762b;
    uv_fs_req_cleanup(&close_req);
    pcStack_5e8 = (code *)0x15764b;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0x100,0);
    if (iVar2 < 0) goto LAB_001577a1;
    if (open_req1.result._4_4_ < 0) goto LAB_001577a6;
    pcStack_5e8 = (code *)0x15766d;
    uv_fs_req_cleanup(&open_req1);
    pcStack_5e8 = (code *)0x15767e;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_5e0 = 0;
    pcStack_5e8 = (code *)0x1576bc;
    iov = uVar21;
    uVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    pcVar12 = (char *)(ulong)uVar3;
    pcStack_5e8 = (code *)0x1576ce;
    printf("read = %d\n",(ulong)uVar3);
    if (uVar3 != 0x1a) goto LAB_001577ab;
    if (read_req.result != 0x1a) goto LAB_001577b0;
    auVar20[0] = -(buf[10] == 'r');
    auVar20[1] = -(buf[0xb] == '\n');
    auVar20[2] = -(buf[0xc] == '\0');
    auVar20[3] = -(buf[0xd] == 't');
    auVar20[4] = -(buf[0xe] == 'e');
    auVar20[5] = -(buf[0xf] == 's');
    auVar20[6] = -(buf[0x10] == 't');
    auVar20[7] = -(buf[0x11] == '-');
    auVar20[8] = -(buf[0x12] == 'b');
    auVar20[9] = -(buf[0x13] == 'u');
    auVar20[10] = -(buf[0x14] == 'f');
    auVar20[0xb] = -(buf[0x15] == 'f');
    auVar20[0xc] = -(buf[0x16] == 'e');
    auVar20[0xd] = -(buf[0x17] == 'r');
    auVar20[0xe] = -(buf[0x18] == '\n');
    auVar20[0xf] = -(buf[0x19] == '\0');
    auVar19[0] = -(buf[0] == 't');
    auVar19[1] = -(buf[1] == 'e');
    auVar19[2] = -(buf[2] == 's');
    auVar19[3] = -(buf[3] == 't');
    auVar19[4] = -(buf[4] == '-');
    auVar19[5] = -(buf[5] == 'b');
    auVar19[6] = -(buf[6] == 'u');
    auVar19[7] = -(buf[7] == 'f');
    auVar19[8] = -(buf[8] == 'f');
    auVar19[9] = -(buf[9] == 'e');
    auVar19[10] = -(buf[10] == 'r');
    auVar19[0xb] = -(buf[0xb] == '\n');
    auVar19[0xc] = -(buf[0xc] == '\0');
    auVar19[0xd] = -(buf[0xd] == 't');
    auVar19[0xe] = -(buf[0xe] == 'e');
    auVar19[0xf] = -(buf[0xf] == 's');
    auVar19 = auVar19 & auVar20;
    if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001577b5;
    pcStack_5e8 = (code *)0x157724;
    uv_fs_req_cleanup(&read_req);
    pcStack_5e8 = (code *)0x15773a;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_001577ba;
    if (close_req.result == 0) {
      pcStack_5e8 = (code *)0x157754;
      uv_fs_req_cleanup(&close_req);
      iVar2 = unlink("test_file");
      return iVar2;
    }
  }
  pcStack_5e8 = run_test_fs_rename_to_existing_file;
  fs_file_open_append_cold_19();
  pcVar14 = "test_file";
  pcStack_600 = (code *)0x1577d8;
  pcStack_5e8 = (code *)pcVar12;
  unlink("test_file");
  pcStack_600 = (code *)0x1577e4;
  unlink("test_file2");
  pcStack_600 = (code *)0x1577e9;
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0;
  pcStack_600 = (code *)0x15780f;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    pcStack_600 = (code *)0x157b05;
    run_test_fs_rename_to_existing_file_cold_1();
LAB_00157b05:
    pcStack_600 = (code *)0x157b0a;
    run_test_fs_rename_to_existing_file_cold_2();
LAB_00157b0a:
    pcStack_600 = (code *)0x157b0f;
    run_test_fs_rename_to_existing_file_cold_3();
LAB_00157b0f:
    pcStack_600 = (code *)0x157b14;
    run_test_fs_rename_to_existing_file_cold_4();
LAB_00157b14:
    pcStack_600 = (code *)0x157b19;
    run_test_fs_rename_to_existing_file_cold_5();
LAB_00157b19:
    pcStack_600 = (code *)0x157b1e;
    run_test_fs_rename_to_existing_file_cold_6();
LAB_00157b1e:
    pcStack_600 = (code *)0x157b23;
    run_test_fs_rename_to_existing_file_cold_7();
LAB_00157b23:
    pcStack_600 = (code *)0x157b28;
    run_test_fs_rename_to_existing_file_cold_8();
LAB_00157b28:
    pcStack_600 = (code *)0x157b2d;
    run_test_fs_rename_to_existing_file_cold_9();
LAB_00157b2d:
    pcStack_600 = (code *)0x157b32;
    run_test_fs_rename_to_existing_file_cold_10();
LAB_00157b32:
    pcStack_600 = (code *)0x157b37;
    run_test_fs_rename_to_existing_file_cold_11();
LAB_00157b37:
    pcStack_600 = (code *)0x157b3c;
    run_test_fs_rename_to_existing_file_cold_12();
LAB_00157b3c:
    pcStack_600 = (code *)0x157b41;
    run_test_fs_rename_to_existing_file_cold_13();
LAB_00157b41:
    pcStack_600 = (code *)0x157b46;
    run_test_fs_rename_to_existing_file_cold_14();
LAB_00157b46:
    pcStack_600 = (code *)0x157b4b;
    run_test_fs_rename_to_existing_file_cold_15();
LAB_00157b4b:
    pcStack_600 = (code *)0x157b50;
    run_test_fs_rename_to_existing_file_cold_16();
LAB_00157b50:
    pcStack_600 = (code *)0x157b55;
    run_test_fs_rename_to_existing_file_cold_17();
LAB_00157b55:
    pcStack_600 = (code *)0x157b5a;
    run_test_fs_rename_to_existing_file_cold_18();
LAB_00157b5a:
    pcStack_600 = (code *)0x157b5f;
    run_test_fs_rename_to_existing_file_cold_19();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157b05;
    pcStack_600 = (code *)0x157831;
    uv_fs_req_cleanup(&open_req1);
    pcStack_600 = (code *)0x157842;
    uVar21 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_5f8 = 0;
    iVar4 = 0;
    pcStack_600 = (code *)0x157880;
    iov = uVar21;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00157b0a;
    if (write_req.result < 0) goto LAB_00157b0f;
    pcStack_600 = (code *)0x1578a2;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_600 = (code *)0x1578b8;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157b14;
    if (close_req.result != 0) goto LAB_00157b19;
    pcStack_600 = (code *)0x1578da;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_600 = (code *)0x1578fd;
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0x41,0x180,0);
    if (iVar2 < 0) goto LAB_00157b1e;
    if (open_req1.result._4_4_ < 0) goto LAB_00157b23;
    pcStack_600 = (code *)0x15791f;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_600 = (code *)0x157935;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157b28;
    if (close_req.result != 0) goto LAB_00157b2d;
    pcStack_600 = (code *)0x157957;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_600 = (code *)0x157976;
    iVar2 = uv_fs_rename(0,&rename_req,"test_file","test_file2",0);
    if (iVar2 != 0) goto LAB_00157b32;
    if (rename_req.result != 0) goto LAB_00157b37;
    pcStack_600 = (code *)0x157998;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_600 = (code *)0x1579b5;
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0,0,0);
    if (iVar2 < 0) goto LAB_00157b3c;
    if (open_req1.result._4_4_ < 0) goto LAB_00157b41;
    pcStack_600 = (code *)0x1579d7;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_600 = (code *)0x1579f9;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_5f8 = 0;
    iVar4 = 0;
    pcStack_600 = (code *)0x157a37;
    iov = uVar21;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00157b46;
    if (read_req.result < 0) goto LAB_00157b4b;
    iVar4 = 0x2e3070;
    pcStack_600 = (code *)0x157a60;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00157b50;
    pcStack_600 = (code *)0x157a74;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_600 = (code *)0x157a8a;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157b55;
    if (close_req.result != 0) goto LAB_00157b5a;
    pcStack_600 = (code *)0x157aac;
    uv_fs_req_cleanup(&close_req);
    pcStack_600 = (code *)0x157ab8;
    unlink("test_file");
    pcStack_600 = (code *)0x157ac4;
    unlink("test_file2");
    pcStack_600 = (code *)0x157ac9;
    pcVar14 = (char *)uv_default_loop();
    pcStack_600 = (code *)0x157add;
    uv_walk(pcVar14,close_walk_cb,0);
    pcStack_600 = (code *)0x157ae7;
    uv_run(pcVar14,0);
    pcStack_600 = (code *)0x157aec;
    iVar4 = uv_default_loop();
    pcStack_600 = (code *)0x157af4;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  pcStack_600 = run_test_fs_read_bufs;
  run_test_fs_rename_to_existing_file_cold_20();
  puStack_608 = (uv_fs_t *)0x157b6a;
  pcStack_600 = (code *)pcVar14;
  fs_read_bufs(iVar4);
  puStack_608 = (uv_fs_t *)0x157b6f;
  fs_read_bufs(iVar4);
  puStack_608 = (uv_fs_t *)0x157b74;
  __s1 = (undefined1 *)uv_default_loop();
  puStack_608 = (uv_fs_t *)0x157b88;
  uv_walk(__s1,close_walk_cb,0);
  puStack_608 = (uv_fs_t *)0x157b92;
  uv_run(__s1,0);
  puStack_608 = (uv_fs_t *)0x157b97;
  uv_default_loop();
  puStack_608 = (uv_fs_t *)0x157b9f;
  iVar2 = uv_loop_close();
  if (iVar2 == 0) {
    return 0;
  }
  puStack_608 = (uv_fs_t *)fs_read_bufs;
  run_test_fs_read_bufs_cold_1();
  iVar4 = 0;
  pcStack_970 = (code *)0x157bd3;
  puStack_610 = __s1;
  puStack_608 = __s;
  iVar2 = uv_fs_open(0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,0);
  if (iVar2 < 0) {
    pcStack_970 = (code *)0x157e0b;
    fs_read_bufs_cold_1();
LAB_00157e0b:
    pcStack_970 = (code *)0x157e10;
    fs_read_bufs_cold_2();
LAB_00157e10:
    pcStack_970 = (code *)0x157e15;
    fs_read_bufs_cold_3();
LAB_00157e15:
    pcStack_970 = (code *)0x157e1a;
    fs_read_bufs_cold_4();
LAB_00157e1a:
    pcStack_970 = (code *)0x157e1f;
    fs_read_bufs_cold_5();
LAB_00157e1f:
    pcStack_970 = (code *)0x157e24;
    fs_read_bufs_cold_6();
LAB_00157e24:
    pcStack_970 = (code *)0x157e29;
    fs_read_bufs_cold_7();
LAB_00157e29:
    pcStack_970 = (code *)0x157e2e;
    fs_read_bufs_cold_8();
LAB_00157e2e:
    pcStack_970 = (code *)0x157e33;
    fs_read_bufs_cold_9();
LAB_00157e33:
    pcStack_970 = (code *)0x157e38;
    fs_read_bufs_cold_10();
LAB_00157e38:
    pcStack_970 = (code *)0x157e3d;
    fs_read_bufs_cold_11();
LAB_00157e3d:
    pcStack_970 = (code *)0x157e42;
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157e0b;
    pcStack_970 = (code *)0x157bf5;
    uv_fs_req_cleanup();
    uStack_968 = 0;
    iVar4 = 0;
    pcStack_970 = (code *)0x157c19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,0,0);
    if (iVar2 != -0x16) goto LAB_00157e10;
    uStack_968 = 0;
    iVar4 = 0;
    pcStack_970 = (code *)0x157c49;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,1,0);
    if (iVar2 != -0x16) goto LAB_00157e15;
    uStack_968 = 0;
    iVar4 = 0;
    pcStack_970 = (code *)0x157c79;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_958,0,0);
    if (iVar2 != -0x16) goto LAB_00157e1a;
    pcStack_970 = (code *)0x157c91;
    auStack_958 = uv_buf_init(auStack_918,0x100);
    __s1 = auStack_958;
    pcStack_970 = (code *)0x157caf;
    auStack_948 = uv_buf_init(auStack_818,0x100);
    pcStack_970 = (code *)0x157cc9;
    auStack_938 = uv_buf_init(auStack_718,0x80);
    pcStack_970 = (code *)0x157ce3;
    auStack_928 = uv_buf_init(auStack_698,0x80);
    uStack_968 = 0;
    iVar4 = 0;
    pcStack_970 = (code *)0x157d13;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0);
    if (iVar2 != 0x1be) goto LAB_00157e1f;
    if (read_req.result != 0x1be) goto LAB_00157e24;
    __s1 = auStack_938;
    __s = &read_req;
    pcStack_970 = (code *)0x157d43;
    uv_fs_req_cleanup();
    uStack_968 = 0;
    iVar4 = 0;
    pcStack_970 = (code *)0x157d6a;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0x100);
    if (iVar2 != 0xbe) goto LAB_00157e29;
    if (read_req.result != 0xbe) goto LAB_00157e2e;
    pcStack_970 = (code *)0x157d92;
    uv_fs_req_cleanup(&read_req);
    __s1 = (undefined1 *)auStack_948._0_8_;
    pcStack_970 = (code *)0x157da9;
    puVar15 = (undefined1 *)auStack_948._0_8_;
    iVar2 = bcmp((void *)auStack_948._0_8_,(void *)auStack_938._0_8_,0x80);
    iVar4 = (int)puVar15;
    if (iVar2 != 0) goto LAB_00157e33;
    __s1 = __s1 + 0x80;
    pcStack_970 = (code *)0x157dc7;
    puVar15 = __s1;
    iVar2 = bcmp(__s1,(void *)auStack_928._0_8_,0x3e);
    iVar4 = (int)puVar15;
    if (iVar2 != 0) goto LAB_00157e38;
    iVar4 = 0;
    pcStack_970 = (code *)0x157de1;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157e3d;
    if (close_req.result == 0) {
      pcStack_970 = (code *)0x157dfb;
      iVar2 = uv_fs_req_cleanup(&close_req);
      return iVar2;
    }
  }
  pcStack_970 = run_test_fs_read_file_eof;
  fs_read_bufs_cold_13();
  pcStack_978 = (code *)0x157e4d;
  pcStack_970 = (code *)__s1;
  fs_read_file_eof(iVar4);
  pcStack_978 = (code *)0x157e52;
  fs_read_file_eof(iVar4);
  pcStack_978 = (code *)0x157e57;
  uVar7 = uv_default_loop();
  pcStack_978 = (code *)0x157e6b;
  uv_walk(uVar7,close_walk_cb,0);
  pcStack_978 = (code *)0x157e75;
  uv_run(uVar7,0);
  pcStack_978 = (code *)0x157e7a;
  uVar8 = uv_default_loop();
  pcStack_978 = (code *)0x157e82;
  iVar2 = uv_loop_close(uVar8);
  if (iVar2 == 0) {
    return 0;
  }
  pcStack_978 = fs_read_file_eof;
  run_test_fs_read_file_eof_cold_1();
  puVar13 = (uv_fs_t *)0x184395;
  puStack_990 = (uv_fs_t *)0x157ea3;
  pcStack_978 = (code *)uVar7;
  unlink("test_file");
  puStack_990 = (uv_fs_t *)0x157ea8;
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0;
  puStack_990 = (uv_fs_t *)0x157ece;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    puStack_990 = (uv_fs_t *)0x15812b;
    fs_read_file_eof_cold_1();
LAB_0015812b:
    puStack_990 = (uv_fs_t *)0x158130;
    fs_read_file_eof_cold_2();
LAB_00158130:
    puStack_990 = (uv_fs_t *)0x158135;
    fs_read_file_eof_cold_3();
LAB_00158135:
    puStack_990 = (uv_fs_t *)0x15813a;
    fs_read_file_eof_cold_4();
LAB_0015813a:
    puStack_990 = (uv_fs_t *)0x15813f;
    fs_read_file_eof_cold_5();
LAB_0015813f:
    puStack_990 = (uv_fs_t *)0x158144;
    fs_read_file_eof_cold_6();
LAB_00158144:
    puStack_990 = (uv_fs_t *)0x158149;
    fs_read_file_eof_cold_7();
LAB_00158149:
    puStack_990 = (uv_fs_t *)0x15814e;
    fs_read_file_eof_cold_8();
LAB_0015814e:
    puStack_990 = (uv_fs_t *)0x158153;
    fs_read_file_eof_cold_9();
LAB_00158153:
    puStack_990 = (uv_fs_t *)0x158158;
    fs_read_file_eof_cold_10();
LAB_00158158:
    puStack_990 = (uv_fs_t *)0x15815d;
    fs_read_file_eof_cold_11();
LAB_0015815d:
    puStack_990 = (uv_fs_t *)0x158162;
    fs_read_file_eof_cold_12();
LAB_00158162:
    puStack_990 = (uv_fs_t *)0x158167;
    fs_read_file_eof_cold_13();
LAB_00158167:
    puStack_990 = (uv_fs_t *)0x15816c;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015812b;
    puStack_990 = (uv_fs_t *)0x157ef0;
    uv_fs_req_cleanup(&open_req1);
    puStack_990 = (uv_fs_t *)0x157f01;
    uVar21 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_988 = 0;
    iVar4 = 0;
    puStack_990 = (uv_fs_t *)0x157f3f;
    iov = uVar21;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158130;
    if (write_req.result < 0) goto LAB_00158135;
    puStack_990 = (uv_fs_t *)0x157f61;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_990 = (uv_fs_t *)0x157f77;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015813a;
    if (close_req.result != 0) goto LAB_0015813f;
    puStack_990 = (uv_fs_t *)0x157f99;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_990 = (uv_fs_t *)0x157fb6;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar2 < 0) goto LAB_00158144;
    if (open_req1.result._4_4_ < 0) goto LAB_00158149;
    puStack_990 = (uv_fs_t *)0x157fd8;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_990 = (uv_fs_t *)0x157ffa;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_988 = 0;
    iVar4 = 0;
    puStack_990 = (uv_fs_t *)0x158038;
    iov = uVar21;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015814e;
    if (read_req.result < 0) goto LAB_00158153;
    iVar4 = 0x2e3070;
    puStack_990 = (uv_fs_t *)0x158061;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00158158;
    puVar13 = &read_req;
    puStack_990 = (uv_fs_t *)0x158078;
    uv_fs_req_cleanup(&read_req);
    puStack_990 = (uv_fs_t *)0x158089;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_988 = 0;
    iVar4 = 0;
    puStack_990 = (uv_fs_t *)0x1580c3;
    iov = uVar21;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,read_req.result);
    if (iVar2 != 0) goto LAB_0015815d;
    if (read_req.result != 0) goto LAB_00158162;
    puStack_990 = (uv_fs_t *)0x1580e5;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_990 = (uv_fs_t *)0x1580fb;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158167;
    if (close_req.result == 0) {
      puStack_990 = (uv_fs_t *)0x158115;
      uv_fs_req_cleanup(&close_req);
      iVar2 = unlink("test_file");
      return iVar2;
    }
  }
  puStack_990 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_998 = (uv_fs_t *)0x158177;
  puStack_990 = puVar13;
  fs_write_multiple_bufs(iVar4);
  puStack_998 = (uv_fs_t *)0x15817c;
  fs_write_multiple_bufs(iVar4);
  puStack_998 = (uv_fs_t *)0x158181;
  uVar7 = uv_default_loop();
  puStack_998 = (uv_fs_t *)0x158195;
  uv_walk(uVar7,close_walk_cb,0);
  puStack_998 = (uv_fs_t *)0x15819f;
  uv_run(uVar7,0);
  puStack_998 = (uv_fs_t *)0x1581a4;
  uVar8 = uv_default_loop();
  puStack_998 = (uv_fs_t *)0x1581ac;
  iVar2 = uv_loop_close(uVar8);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_998 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  uStack_9a0 = uVar7;
  puStack_998 = __s;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0;
  iVar4 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar4 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_0015864c:
    fs_write_multiple_bufs_cold_2();
LAB_00158651:
    fs_write_multiple_bufs_cold_3();
LAB_00158656:
    fs_write_multiple_bufs_cold_4();
LAB_0015865b:
    fs_write_multiple_bufs_cold_5();
LAB_00158660:
    fs_write_multiple_bufs_cold_6();
LAB_00158665:
    fs_write_multiple_bufs_cold_7();
LAB_0015866a:
    fs_write_multiple_bufs_cold_8();
LAB_0015866f:
    fs_write_multiple_bufs_cold_9();
LAB_00158674:
    fs_write_multiple_bufs_cold_10();
LAB_00158679:
    fs_write_multiple_bufs_cold_11();
LAB_0015867e:
    fs_write_multiple_bufs_cold_12();
LAB_00158683:
    fs_write_multiple_bufs_cold_13();
LAB_00158688:
    fs_write_multiple_bufs_cold_14();
LAB_0015868d:
    fs_write_multiple_bufs_cold_15();
LAB_00158692:
    fs_write_multiple_bufs_cold_16();
LAB_00158697:
    fs_write_multiple_bufs_cold_19();
LAB_0015869c:
    fs_write_multiple_bufs_cold_20();
LAB_001586a1:
    fs_write_multiple_bufs_cold_21();
LAB_001586a6:
    fs_write_multiple_bufs_cold_22();
LAB_001586ab:
    fs_write_multiple_bufs_cold_23();
LAB_001586b0:
    fs_write_multiple_bufs_cold_24();
LAB_001586b5:
    fs_write_multiple_bufs_cold_25();
LAB_001586ba:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015864c;
    uv_fs_req_cleanup(&open_req1);
    auStack_9c8 = uv_buf_init(test_buf,0xd);
    auStack_9b8 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,auStack_9c8,2,0);
    if (iVar4 < 0) goto LAB_00158651;
    if (write_req.result < 0) goto LAB_00158656;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_0015865b;
    if (close_req.result != 0) goto LAB_00158660;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar4 < 0) goto LAB_00158665;
    if (open_req1.result._4_4_ < 0) goto LAB_0015866a;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    auVar19 = uv_buf_init(buf,0xd);
    auStack_9c8 = auVar19;
    auVar19 = uv_buf_init(buf2);
    iVar2 = (int)open_req1.result;
    auStack_9b8 = auVar19;
    _Var9 = lseek64((int)open_req1.result,0,1);
    if (_Var9 != 0) goto LAB_0015866f;
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_9c8,2,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00158674;
    if (read_req.result != 0x1c) goto LAB_00158679;
    iVar2 = 0x2e3070;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_0015867e;
    iVar2 = 0x2e4460;
    iVar4 = strcmp(buf2,test_buf2);
    if (iVar4 != 0) goto LAB_00158683;
    uv_fs_req_cleanup(&read_req);
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar21;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 != 0) goto LAB_00158688;
    if (read_req.result != 0) goto LAB_0015868d;
    uv_fs_req_cleanup(&read_req);
    auVar19 = uv_buf_init(buf,0xd);
    auStack_9c8 = auVar19;
    auVar19 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    auStack_9b8 = auVar19;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_9c8,2,0);
    if (iVar4 < 0) goto LAB_00158692;
    if (read_req.result == 0x1c) {
LAB_0015854a:
      iVar2 = 0x2e3070;
      iVar4 = strcmp(buf,test_buf);
      if (iVar4 != 0) goto LAB_00158697;
      iVar2 = 0x2e4460;
      iVar4 = strcmp(buf2,test_buf2);
      if (iVar4 != 0) goto LAB_0015869c;
      uv_fs_req_cleanup(&read_req);
      uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar21;
      iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0x1c);
      if (iVar4 != 0) goto LAB_001586a1;
      if (read_req.result != 0) goto LAB_001586a6;
      uv_fs_req_cleanup();
      iVar2 = 0;
      iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      if (iVar4 != 0) goto LAB_001586ab;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        iVar2 = unlink("test_file");
        return iVar2;
      }
      goto LAB_001586b0;
    }
    if (read_req.result != 0xd) goto LAB_001586b5;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_9b8,1,read_req.result);
    if (iVar4 < 0) goto LAB_001586ba;
    if (read_req.result == 0xf) goto LAB_0015854a;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  uVar7 = uv_default_loop();
  uv_walk(uVar7,close_walk_cb,0);
  uv_run(uVar7,0);
  uVar7 = uv_default_loop();
  iVar2 = uv_loop_close(uVar7);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0xd4310;
  pvVar10 = malloc(0xd4310);
  if (pvVar10 == (void *)0x0) {
LAB_00158a3c:
    fs_write_alotof_bufs_cold_18();
LAB_00158a41:
    fs_write_alotof_bufs_cold_1();
LAB_00158a46:
    fs_write_alotof_bufs_cold_2();
LAB_00158a4b:
    fs_write_alotof_bufs_cold_3();
LAB_00158a50:
    fs_write_alotof_bufs_cold_4();
LAB_00158a55:
    fs_write_alotof_bufs_cold_17();
LAB_00158a5a:
    fs_write_alotof_bufs_cold_5();
LAB_00158a5f:
    fs_write_alotof_bufs_cold_6();
LAB_00158a64:
    fs_write_alotof_bufs_cold_7();
LAB_00158a69:
    fs_write_alotof_bufs_cold_8();
LAB_00158a6e:
    fs_write_alotof_bufs_cold_9();
LAB_00158a73:
    fs_write_alotof_bufs_cold_10();
LAB_00158a78:
    fs_write_alotof_bufs_cold_12();
LAB_00158a7d:
    fs_write_alotof_bufs_cold_13();
LAB_00158a82:
    fs_write_alotof_bufs_cold_14();
LAB_00158a87:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar4 < 0) goto LAB_00158a41;
    if (open_req1.result._4_4_ < 0) goto LAB_00158a46;
    uv_fs_req_cleanup(&open_req1);
    lVar17 = 8;
    do {
      auVar19 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar10 + lVar17 + -8) = auVar19._0_8_;
      *(long *)((long)pvVar10 + lVar17) = auVar19._8_8_;
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar10,0xd431,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00158a4b;
    if (write_req.result != 0xac67d) goto LAB_00158a50;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pvVar11 = malloc(0xac67d);
    if (pvVar11 == (void *)0x0) goto LAB_00158a55;
    lVar17 = 8;
    pvVar18 = pvVar11;
    do {
      auVar19 = uv_buf_init(pvVar18,0xd);
      *(long *)((long)pvVar10 + lVar17 + -8) = auVar19._0_8_;
      *(long *)((long)pvVar10 + lVar17) = auVar19._8_8_;
      lVar17 = lVar17 + 0x10;
      pvVar18 = (void *)((long)pvVar18 + 0xd);
    } while (lVar17 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar4 != 0) goto LAB_00158a5a;
    if (close_req.result != 0) goto LAB_00158a5f;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar4 < 0) goto LAB_00158a64;
    if (open_req1.result._4_4_ < 0) goto LAB_00158a69;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar10,0xd431,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00158a6e;
    if (read_req.result != 0x3400) goto LAB_00158a73;
    unaff_R12 = 0;
    do {
      pcVar12 = (char *)((long)pvVar11 + unaff_R12);
      iVar4 = strncmp(pcVar12,test_buf,0xd);
      iVar2 = (int)pcVar12;
      if (iVar4 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00158a3c;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar11);
    iVar2 = (int)open_req1.result;
    _Var9 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var9 != write_req.result) goto LAB_00158a78;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar21;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 != 0) goto LAB_00158a7d;
    if (read_req.result != 0) goto LAB_00158a82;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00158a87;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar10);
      return extraout_EAX_00;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  pvVar10 = (void *)uv_default_loop();
  uv_walk(pvVar10,close_walk_cb,0);
  uv_run(pvVar10,0);
  uVar7 = uv_default_loop();
  iVar2 = uv_loop_close(uVar7);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_a50 = (code *)0x158af0;
  uStack_a48 = extraout_RAX_00;
  pvStack_a40 = pvVar10;
  lStack_a38 = unaff_R12;
  unlink("test_file");
  pcStack_a50 = (code *)0x158af5;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_a50 = (code *)0x158b06;
  pvVar11 = malloc(0xd4310);
  if (pvVar11 == (void *)0x0) {
LAB_00158e4b:
    pvVar11 = pvVar10;
    pcStack_a50 = (code *)0x158e50;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00158e50:
    pcStack_a50 = (code *)0x158e55;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00158e55:
    pcStack_a50 = (code *)0x158e5a;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00158e5a:
    pcStack_a50 = (code *)0x158e5f;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00158e5f:
    pcStack_a50 = (code *)0x158e64;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00158e64:
    pcStack_a50 = (code *)0x158e69;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00158e69:
    pcStack_a50 = (code *)0x158e6e;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00158e6e:
    pcStack_a50 = (code *)0x158e73;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00158e73:
    pcStack_a50 = (code *)0x158e78;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00158e78:
    pcStack_a50 = (code *)0x158e7d;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00158e7d:
    pcStack_a50 = (code *)0x158e82;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00158e82:
    pcStack_a50 = (code *)0x158e87;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00158e87:
    pcStack_a50 = (code *)0x158e8c;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00158e8c:
    pcStack_a50 = (code *)0x158e91;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00158e91:
    pcStack_a50 = (code *)0x158e96;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_a50 = (code *)0x158b35;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_00158e50;
    if (open_req1.result._4_4_ < 0) goto LAB_00158e55;
    pcStack_a50 = (code *)0x158b57;
    uv_fs_req_cleanup(&open_req1);
    pcStack_a50 = (code *)0x158b68;
    uVar21 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_a48 = 0;
    pcStack_a50 = (code *)0x158ba6;
    iov = uVar21;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 10) goto LAB_00158e5a;
    if (write_req.result != 10) goto LAB_00158e5f;
    pcStack_a50 = (code *)0x158bc9;
    uv_fs_req_cleanup(&write_req);
    lVar17 = 8;
    do {
      pcStack_a50 = (code *)0x158be3;
      auVar19 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar11 + lVar17 + -8) = auVar19._0_8_;
      *(long *)((long)pvVar11 + lVar17) = auVar19._8_8_;
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0xd4318);
    uStack_a48 = 0;
    pcStack_a50 = (code *)0x158c24;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar11,0xd431,10);
    if (iVar2 < 0) goto LAB_00158e64;
    if (write_req.result != 0xac67d) goto LAB_00158e69;
    pcStack_a50 = (code *)0x158c49;
    uv_fs_req_cleanup(&write_req);
    pcStack_a50 = (code *)0x158c53;
    pcVar12 = (char *)malloc(0xac67d);
    if (pcVar12 == (char *)0x0) goto LAB_00158e6e;
    lVar17 = 8;
    pcVar14 = pcVar12;
    do {
      pcStack_a50 = (code *)0x158c75;
      auVar19 = uv_buf_init(pcVar14,0xd);
      *(long *)((long)pvVar11 + lVar17 + -8) = auVar19._0_8_;
      *(long *)((long)pvVar11 + lVar17) = auVar19._8_8_;
      lVar17 = lVar17 + 0x10;
      pcVar14 = pcVar14 + 0xd;
    } while (lVar17 != 0xd4318);
    uStack_a48 = 0;
    pcStack_a50 = (code *)0x158cba;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar11,0xd431,10);
    if (iVar2 < 0) goto LAB_00158e73;
    lVar17 = 0xd;
    if (iVar2 != 0xd) {
      lVar17 = 0x3400;
    }
    if (read_req.result != lVar17) goto LAB_00158e78;
    pcVar14 = pcVar12;
    uVar16 = 0;
    do {
      pcStack_a50 = (code *)0x158cff;
      iVar4 = strncmp(pcVar14,test_buf,0xd);
      if (iVar4 != 0) {
        pcStack_a50 = (code *)0x158e4b;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar10 = pvVar11;
        goto LAB_00158e4b;
      }
      if (iVar2 == 0xd) break;
      pcVar14 = pcVar14 + 0xd;
      bVar1 = uVar16 < 0x3ff;
      uVar16 = uVar16 + 1;
    } while (bVar1);
    pcStack_a50 = (code *)0x158d2c;
    uv_fs_req_cleanup(&read_req);
    pcStack_a50 = (code *)0x158d34;
    free(pcVar12);
    pcStack_a50 = (code *)0x158d4b;
    iVar2 = uv_fs_stat(0,&stat_req,"test_file",0);
    if (iVar2 != 0) goto LAB_00158e7d;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00158e82;
    pcStack_a50 = (code *)0x158d7b;
    uv_fs_req_cleanup(&stat_req);
    pcStack_a50 = (code *)0x158d8c;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_a48 = 0;
    pcStack_a50 = (code *)0x158dce;
    iov = uVar21;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,write_req.result + 10);
    if (iVar2 != 0) goto LAB_00158e87;
    if (read_req.result != 0) goto LAB_00158e8c;
    pcStack_a50 = (code *)0x158df0;
    uv_fs_req_cleanup(&read_req);
    pcStack_a50 = (code *)0x158e06;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158e91;
    if (close_req.result == 0) {
      pcStack_a50 = (code *)0x158e24;
      uv_fs_req_cleanup(&close_req);
      pcStack_a50 = (code *)0x158e30;
      unlink("test_file");
      free(pvVar11);
      return extraout_EAX_01;
    }
  }
  pcStack_a50 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_a50 = (code *)pvVar11;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_0015900d;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar2 < 0) goto LAB_00159012;
    uv_fs_req_cleanup(&open_req1);
    uVar21 = (uv_buf_t)uv_buf_init(auStack_a52,2);
    iov = uVar21;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar2 != -0x15) goto LAB_00159017;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar7 = uv_default_loop();
      uv_walk(uVar7,close_walk_cb,0);
      uv_run(uVar7,0);
      uVar7 = uv_default_loop();
      iVar2 = uv_loop_close(uVar7);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00159021;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_0015900d:
    run_test_fs_read_dir_cold_2();
LAB_00159012:
    run_test_fs_read_dir_cold_3();
LAB_00159017:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00159021:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return 0;
}

Assistant:

TEST_IMPL(fs_scandir_empty_dir) {
  const char* path;
  uv_fs_t req;
  uv_dirent_t dent;
  int r;

  path = "./empty_dir/";
  loop = uv_default_loop();

  uv_fs_mkdir(NULL, &req, path, 0777, NULL);
  uv_fs_req_cleanup(&req);

  /* Fill the req to ensure that required fields are cleaned up */
  memset(&req, 0xdb, sizeof(req));

  r = uv_fs_scandir(NULL, &req, path, 0, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  ASSERT(req.ptr == NULL);
  ASSERT(UV_EOF == uv_fs_scandir_next(&req, &dent));
  uv_fs_req_cleanup(&req);

  r = uv_fs_scandir(loop, &scandir_req, path, 0, empty_scandir_cb);
  ASSERT(r == 0);

  ASSERT(scandir_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(scandir_cb_count == 1);

  uv_fs_rmdir(NULL, &req, path, NULL);
  uv_fs_req_cleanup(&req);

  MAKE_VALGRIND_HAPPY();
  return 0;
}